

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::EnumValueDescriptorProto::ByteSizeLong(EnumValueDescriptorProto *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) == 0) {
    sVar7 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar7 = 0;
    }
    else {
      lVar3 = *(long *)(((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar4 = (uint)lVar3 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = lVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = EnumValueOptions::ByteSizeLong(this->options_);
      uVar4 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      uVar6 = (long)this->number_ | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar7,&this->_cached_size_);
  return sVar7;
}

Assistant:

size_t EnumValueDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.EnumValueOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 number = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_number());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}